

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_38e3a9::Db::parseTemplateArgs(Db *this,bool TagTemplates)

{
  Node **ppNVar1;
  _func_int **pp_Var2;
  BumpPointerAllocator **ppBVar3;
  Node **__src;
  char *pcVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node **__dest;
  Node *pNVar7;
  char *pcVar8;
  long lVar9;
  _func_int **pp_Var10;
  _func_int **pp_Var11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *this_00;
  Node **ppNVar18;
  _func_int **pp_Var19;
  Node NVar20;
  Node *Arg_1;
  Node *local_a8;
  BumpPointerAllocator **ppBStack_a0;
  Node local_98 [4];
  BumpPointerAllocator *local_58;
  PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL> *local_50;
  size_t local_48;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *local_40;
  Node *Arg;
  
  pcVar4 = this->First;
  pcVar8 = this->Last;
  if ((pcVar4 == pcVar8) || (*pcVar4 != 'I')) {
    return (Node *)0x0;
  }
  pcVar4 = pcVar4 + 1;
  this->First = pcVar4;
  if (TagTemplates) {
    (this->TemplateParams).Last = (this->TemplateParams).First;
  }
  this_00 = &this->Names;
  local_48 = (long)(this->Names).Last - (long)(this->Names).First >> 3;
  ppNVar1 = (this->TemplateParams).Inline;
  local_50 = &this->ForwardTemplateRefs;
  local_58 = &this->ASTAllocator;
  local_40 = this_00;
  do {
    if ((pcVar4 != pcVar8) && (*pcVar4 == 'E')) {
      this->First = pcVar4 + 1;
      NVar20 = (Node)popTrailingNodeArray(this,local_48);
      pNVar7 = (Node *)BumpPointerAllocator::allocate(local_58,0x20);
      pNVar7->K = KTemplateArgs;
      pNVar7->RHSComponentCache = No;
      pNVar7->ArrayCache = No;
      pNVar7->FunctionCache = No;
      pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001f85f0;
      pNVar7[1] = NVar20;
      return pNVar7;
    }
    if (TagTemplates) {
      ppBStack_a0 = &local_58;
      pNVar7 = (Node *)(this->TemplateParams).First;
      if (pNVar7 == (Node *)ppNVar1) {
        sVar12 = (long)(this->TemplateParams).Last - (long)ppNVar1;
        Arg_1 = local_98;
        if (sVar12 == 0) {
          sVar12 = 0;
        }
        else {
          local_a8 = local_98;
          memmove(local_98,pNVar7,sVar12);
        }
        local_a8 = (Node *)((long)&local_98[0]._vptr_Node + sVar12);
        (this->TemplateParams).Last = (Node **)pNVar7;
      }
      else {
        local_a8 = (Node *)(this->TemplateParams).Last;
        ppBStack_a0 = (BumpPointerAllocator **)(this->TemplateParams).Cap;
        (this->TemplateParams).First = ppNVar1;
        (this->TemplateParams).Last = ppNVar1;
        (this->TemplateParams).Cap = (Node **)local_50;
        Arg_1 = pNVar7;
      }
      pNVar5 = parseTemplateArg(this);
      pNVar7 = (Node *)(this->TemplateParams).First;
      Arg = pNVar5;
      if (Arg_1 == local_98) {
        if (pNVar7 != (Node *)ppNVar1) {
          free(pNVar7);
          (this->TemplateParams).First = ppNVar1;
          (this->TemplateParams).Last = ppNVar1;
          (this->TemplateParams).Cap = (Node **)local_50;
          pNVar7 = (Node *)ppNVar1;
        }
        pNVar6 = Arg_1;
        if ((long)local_a8 - (long)Arg_1 != 0) {
          memmove(pNVar7,Arg_1,(long)local_a8 - (long)Arg_1);
          pNVar7 = (Node *)(this->TemplateParams).First;
          pNVar6 = local_a8;
        }
        (this->TemplateParams).Last = (Node **)(((long)pNVar6 - (long)Arg_1) + (long)pNVar7);
        local_a8 = Arg_1;
      }
      else {
        (this->TemplateParams).First = (Node **)Arg_1;
        if (pNVar7 == (Node *)ppNVar1) {
          (this->TemplateParams).Last = (Node **)local_a8;
          (this->TemplateParams).Cap = (Node **)ppBStack_a0;
          ppBStack_a0 = &local_58;
          local_a8 = local_98;
        }
        else {
          ppBVar3 = (BumpPointerAllocator **)(this->TemplateParams).Cap;
          (this->TemplateParams).Last = (Node **)local_a8;
          (this->TemplateParams).Cap = (Node **)ppBStack_a0;
          local_a8 = pNVar7;
          ppBStack_a0 = ppBVar3;
        }
      }
      Arg_1 = local_a8;
      if (pNVar5 == (Node *)0x0) {
        PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::~PODSmallVector
                  ((PODSmallVector<(anonymous_namespace)::Node_*,_8UL> *)&Arg_1);
        return (Node *)0x0;
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(this_00,&Arg);
      if (pNVar5->K == KTemplateArgumentPack) {
        pp_Var19 = pNVar5[1]._vptr_Node;
        lVar9 = *(long *)&pNVar5[1].K;
        pNVar5 = (Node *)BumpPointerAllocator::allocate(local_58,0x20);
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001f8598;
        pNVar5[1]._vptr_Node = pp_Var19;
        pNVar5[1].K = (char)lVar9;
        pNVar5[1].RHSComponentCache = (char)((ulong)lVar9 >> 8);
        pNVar5[1].ArrayCache = (char)((ulong)lVar9 >> 0x10);
        pNVar5[1].FunctionCache = (char)((ulong)lVar9 >> 0x18);
        *(int *)&pNVar5[1].field_0xc = (int)((ulong)lVar9 >> 0x20);
        pNVar5->K = KParameterPack;
        pNVar5->RHSComponentCache = Unknown;
        pNVar5->ArrayCache = Unknown;
        pNVar5->FunctionCache = Unknown;
        pp_Var2 = pp_Var19 + lVar9;
        lVar17 = lVar9 << 3;
        lVar9 = lVar9 >> 2;
        pp_Var10 = pp_Var19;
        lVar13 = lVar17;
        for (lVar15 = lVar9; pp_Var11 = pp_Var19, lVar14 = lVar17, lVar16 = lVar9, 0 < lVar15;
            lVar15 = lVar15 + -1) {
          if ((*pp_Var10)[10] != (_func_int)0x1) goto LAB_0019623d;
          if (pp_Var10[1][10] != (_func_int)0x1) {
            pp_Var10 = pp_Var10 + 1;
            goto LAB_0019623d;
          }
          if (pp_Var10[2][10] != (_func_int)0x1) {
            pp_Var10 = pp_Var10 + 2;
            goto LAB_0019623d;
          }
          if (pp_Var10[3][10] != (_func_int)0x1) {
            pp_Var10 = pp_Var10 + 3;
            goto LAB_0019623d;
          }
          pp_Var10 = pp_Var10 + 4;
          lVar13 = lVar13 + -0x20;
        }
        lVar13 = lVar13 >> 3;
        if (lVar13 == 1) {
LAB_00196222:
          if ((*pp_Var10)[10] != (_func_int)0x1) goto LAB_0019623d;
LAB_00196242:
          pNVar5->ArrayCache = No;
        }
        else {
          if (lVar13 == 2) {
LAB_00196215:
            if ((*pp_Var10)[10] == (_func_int)0x1) {
              pp_Var10 = pp_Var10 + 1;
              goto LAB_00196222;
            }
          }
          else {
            if (lVar13 != 3) goto LAB_00196242;
            if ((*pp_Var10)[10] == (_func_int)0x1) {
              pp_Var10 = pp_Var10 + 1;
              goto LAB_00196215;
            }
          }
LAB_0019623d:
          if (pp_Var10 == pp_Var2) goto LAB_00196242;
        }
        for (; 0 < lVar16; lVar16 = lVar16 + -1) {
          if ((*pp_Var11)[0xb] != (_func_int)0x1) goto LAB_001962d8;
          if (pp_Var11[1][0xb] != (_func_int)0x1) {
            pp_Var11 = pp_Var11 + 1;
            goto LAB_001962d8;
          }
          if (pp_Var11[2][0xb] != (_func_int)0x1) {
            pp_Var11 = pp_Var11 + 2;
            goto LAB_001962d8;
          }
          if (pp_Var11[3][0xb] != (_func_int)0x1) {
            pp_Var11 = pp_Var11 + 3;
            goto LAB_001962d8;
          }
          pp_Var11 = pp_Var11 + 4;
          lVar14 = lVar14 + -0x20;
        }
        lVar14 = lVar14 >> 3;
        if (lVar14 == 1) {
LAB_001962bd:
          if ((*pp_Var11)[0xb] != (_func_int)0x1) goto LAB_001962d8;
LAB_001962dd:
          pNVar5->FunctionCache = No;
        }
        else {
          if (lVar14 == 2) {
LAB_001962b0:
            if ((*pp_Var11)[0xb] == (_func_int)0x1) {
              pp_Var11 = pp_Var11 + 1;
              goto LAB_001962bd;
            }
          }
          else {
            if (lVar14 != 3) goto LAB_001962dd;
            if ((*pp_Var11)[0xb] == (_func_int)0x1) {
              pp_Var11 = pp_Var11 + 1;
              goto LAB_001962b0;
            }
          }
LAB_001962d8:
          if (pp_Var11 == pp_Var2) goto LAB_001962dd;
        }
        for (; 0 < lVar9; lVar9 = lVar9 + -1) {
          if ((*pp_Var19)[9] != (_func_int)0x1) goto LAB_00196365;
          if (pp_Var19[1][9] != (_func_int)0x1) {
            pp_Var19 = pp_Var19 + 1;
            goto LAB_00196365;
          }
          if (pp_Var19[2][9] != (_func_int)0x1) {
            pp_Var19 = pp_Var19 + 2;
            goto LAB_00196365;
          }
          if (pp_Var19[3][9] != (_func_int)0x1) {
            pp_Var19 = pp_Var19 + 3;
            goto LAB_00196365;
          }
          pp_Var19 = pp_Var19 + 4;
          lVar17 = lVar17 + -0x20;
        }
        lVar17 = lVar17 >> 3;
        if (lVar17 == 1) {
LAB_00196453:
          if ((*pp_Var19)[9] != (_func_int)0x1) goto LAB_00196365;
        }
        else {
          if (lVar17 == 2) {
LAB_0019643b:
            if ((*pp_Var19)[9] == (_func_int)0x1) {
              pp_Var19 = pp_Var19 + 1;
              goto LAB_00196453;
            }
          }
          else {
            if (lVar17 != 3) goto LAB_0019636a;
            if ((*pp_Var19)[9] == (_func_int)0x1) {
              pp_Var19 = pp_Var19 + 1;
              goto LAB_0019643b;
            }
          }
LAB_00196365:
          if (pp_Var19 != pp_Var2) goto LAB_0019636f;
        }
LAB_0019636a:
        pNVar5->RHSComponentCache = No;
      }
LAB_0019636f:
      ppNVar18 = (this->TemplateParams).Last;
      if (ppNVar18 == (this->TemplateParams).Cap) {
        __src = (this->TemplateParams).First;
        sVar12 = (long)ppNVar18 - (long)__src;
        if (__src == ppNVar1) {
          __dest = (Node **)malloc(sVar12 * 2);
          if (__dest == (Node **)0x0) goto LAB_001964c7;
          if (ppNVar18 != ppNVar1) {
            memmove(__dest,__src,sVar12);
          }
          (this->TemplateParams).First = __dest;
        }
        else {
          __dest = (Node **)realloc(__src,sVar12 * 2);
          (this->TemplateParams).First = __dest;
          if (__dest == (Node **)0x0) {
LAB_001964c7:
            std::terminate();
          }
        }
        ppNVar18 = (Node **)((long)__dest + sVar12);
        (this->TemplateParams).Cap = __dest + ((long)sVar12 >> 2);
        this_00 = local_40;
      }
      (this->TemplateParams).Last = ppNVar18 + 1;
      *ppNVar18 = pNVar5;
      PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::~PODSmallVector
                ((PODSmallVector<(anonymous_namespace)::Node_*,_8UL> *)&Arg_1);
    }
    else {
      Arg_1 = parseTemplateArg(this);
      if (Arg_1 == (Node *)0x0) {
        return (Node *)0x0;
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(this_00,&Arg_1);
    }
    pcVar4 = this->First;
    pcVar8 = this->Last;
  } while( true );
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }